

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUnary(Parser *this)

{
  Position *__args_1;
  bool bVar1;
  mapped_type *pmVar2;
  __tuple_element_t<1UL,_tuple<unsigned_char,_OperatorType,_Associativity>_> *p_Var3;
  reference __in;
  type *ptVar4;
  Token *this_00;
  __tuple_element_t<0UL,_tuple<unsigned_char,_OperatorType,_Associativity>_> *p_Var5;
  Position *this_01;
  pointer this_02;
  Position *pos;
  undefined8 *in_RSI;
  Position local_78;
  undefined1 local_60 [16];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_50;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  _Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false> _Stack_40;
  Precedence prec;
  key_type local_32;
  _Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false> local_30;
  const_iterator bioptounop;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Stack_20;
  TokenType type;
  Token *tok;
  Parser *this_local;
  
  this_local = this;
  _Stack_20._M_head_impl = (Expr *)Lexer::getCurrentToken((Lexer *)*in_RSI);
  bVar1 = Token::operator==((Token *)_Stack_20._M_head_impl,TOK_OP_BRACKET_OPEN);
  if (bVar1) {
    parseBrackets(this);
  }
  else {
    bVar1 = Token::operator==((Token *)_Stack_20._M_head_impl,TOK_OP_ARR_BRACKET_OPEN);
    if (bVar1) {
      parseArray(this);
    }
    else {
      bioptounop.
      super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
      _M_cur._6_2_ = Token::getType((Token *)_Stack_20._M_head_impl);
      bioptounop.
      super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
      _M_cur._4_2_ = Token::getType((Token *)_Stack_20._M_head_impl);
      pmVar2 = std::
               unordered_map<pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>_>
               ::at((unordered_map<pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>_>
                     *)OPERATORS_INFO,
                    (key_type *)
                    ((long)&bioptounop.
                            super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>
                            ._M_cur + 4));
      p_Var3 = std::get<1ul,unsigned_char,pfederc::OperatorType,pfederc::Associativity>(pmVar2);
      if (*p_Var3 == BINARY) {
        local_32 = Token::getType((Token *)_Stack_20._M_head_impl);
        local_30._M_cur =
             (__node_type *)
             std::
             unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
             ::find((unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                     *)TOKEN_BIOP_TO_UNOP,&local_32);
        _Stack_40._M_cur =
             (__node_type *)
             std::
             unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
             ::end((unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                    *)TOKEN_BIOP_TO_UNOP);
        bVar1 = std::__detail::operator==(&local_30,&stack0xffffffffffffffc0);
        if (bVar1) {
          std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
          unique_ptr<std::default_delete<pfederc::Expr>,void>
                    ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                     (nullptr_t)0x0);
          return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
                 this;
        }
        __in = std::__detail::
               _Node_const_iterator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false,_false>
                            *)&local_30);
        ptVar4 = std::get<1ul,pfederc::TokenType_const,pfederc::TokenType>(__in);
        bioptounop.
        super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
        _M_cur._6_2_ = *ptVar4;
      }
      Lexer::next((Lexer *)*in_RSI);
      while( true ) {
        this_00 = Lexer::getCurrentToken((Lexer *)*in_RSI);
        bVar1 = Token::operator==(this_00,TOK_EOL);
        if (!bVar1) break;
        Lexer::next((Lexer *)*in_RSI);
      }
      pmVar2 = std::
               unordered_map<pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>_>
               ::at((unordered_map<pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>_>
                     *)OPERATORS_INFO,
                    (key_type *)
                    ((long)&bioptounop.
                            super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>
                            ._M_cur + 6));
      p_Var5 = std::get<0ul,unsigned_char,pfederc::OperatorType,pfederc::Associativity>(pmVar2);
      expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._7_1_ = *p_Var5;
      parseExpression((Parser *)&local_50,(Precedence)in_RSI);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_50);
      if (bVar1) {
        __args_1 = (Position *)*in_RSI;
        this_01 = Token::getPosition((Token *)_Stack_20._M_head_impl);
        this_02 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                            (&local_50);
        pos = Expr::getPosition(this_02);
        Position::operator+(&local_78,this_01,pos);
        std::
        make_unique<pfederc::UnOpExpr,pfederc::Lexer&,pfederc::Position,pfederc::Token_const*&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)local_60,__args_1,(Token **)&local_78,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   &stack0xffffffffffffffe0);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::UnOpExpr,std::default_delete<pfederc::UnOpExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                   local_60);
        std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                   local_60);
      }
      else {
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      local_60._12_4_ = 1;
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_50);
    }
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUnary() noexcept {
  const Token *tok = lexer.getCurrentToken();
  if (*tok == TokenType::TOK_OP_BRACKET_OPEN)
    return parseBrackets();
  else if (*tok == TokenType::TOK_OP_ARR_BRACKET_OPEN)
    return parseArray();

  
  TokenType type = tok->getType();
  if (std::get<1>(OPERATORS_INFO.at(tok->getType())) == OperatorType::BINARY) {
    auto bioptounop = TOKEN_BIOP_TO_UNOP.find(tok->getType());
    if (bioptounop == TOKEN_BIOP_TO_UNOP.end())
      return nullptr;

    type = std::get<1>(*bioptounop);
  }

  lexer.next(); // eat unary operator
  // ignore newline tekons
  while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
    lexer.next();

  const Precedence prec = std::get<0>(OPERATORS_INFO.at(type));
  std::unique_ptr<Expr> expr = parseExpression(prec);
  if (!expr)
    return nullptr;

  return std::make_unique<UnOpExpr>(lexer,
    tok->getPosition() + expr->getPosition(), tok, std::move(expr));
}